

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int wait_for_edge(uint user_gpio,uint edge,double timeout)

{
  bool bVar1;
  int iVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double due;
  int id;
  int triggered;
  CBFuncEx_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 local_4;
  
  local_4 = 0;
  if (0.0 < in_XMM0_Qa) {
    dVar3 = time_time();
    iVar2 = callback_ex(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8,(void *)0x107c99);
    while( true ) {
      bVar1 = false;
      if (local_4 == 0) {
        dVar4 = time_time();
        bVar1 = dVar4 < dVar3 + in_XMM0_Qa;
      }
      if (!bVar1) break;
      time_sleep((double)CONCAT44(local_4,iVar2));
    }
    callback_cancel(in_stack_ffffffffffffffd0);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int wait_for_edge(unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.1);

   callback_cancel(id);

   return triggered;
}